

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O0

int mbedtls_mpi_core_write_le(mbedtls_mpi_uint *A,size_t A_limbs,uchar *output,size_t output_length)

{
  ulong uVar1;
  ulong in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  size_t i_1;
  size_t i;
  size_t bytes_to_copy;
  size_t stored_bytes;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  uVar1 = in_RSI * 8;
  local_40 = in_RCX;
  local_38 = uVar1;
  if (in_RCX <= uVar1) {
    for (; local_38 = in_RCX, local_40 < uVar1; local_40 = local_40 + 1) {
      if ((*(ulong *)(in_RDI + (local_40 & 0xfffffffffffffff8)) >> (sbyte)((local_40 & 7) << 3) &
          0xff) != 0) {
        return -8;
      }
    }
  }
  for (local_48 = 0; local_48 < local_38; local_48 = local_48 + 1) {
    *(char *)(in_RDX + local_48) =
         (char)(*(ulong *)(in_RDI + (local_48 & 0xfffffffffffffff8)) >> (sbyte)((local_48 & 7) << 3)
               );
  }
  if (uVar1 < in_RCX) {
    memset((void *)(in_RDX + uVar1),0,in_RCX + in_RSI * -8);
  }
  return 0;
}

Assistant:

int mbedtls_mpi_core_write_le(const mbedtls_mpi_uint *A,
                              size_t A_limbs,
                              unsigned char *output,
                              size_t output_length)
{
    size_t stored_bytes = A_limbs * ciL;
    size_t bytes_to_copy;

    if (stored_bytes < output_length) {
        bytes_to_copy = stored_bytes;
    } else {
        bytes_to_copy = output_length;

        /* The output buffer is smaller than the allocated size of A.
         * However A may fit if its leading bytes are zero. */
        for (size_t i = bytes_to_copy; i < stored_bytes; i++) {
            if (GET_BYTE(A, i) != 0) {
                return MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL;
            }
        }
    }

    for (size_t i = 0; i < bytes_to_copy; i++) {
        output[i] = GET_BYTE(A, i);
    }

    if (stored_bytes < output_length) {
        /* Write trailing 0 bytes */
        memset(output + stored_bytes, 0, output_length - stored_bytes);
    }

    return 0;
}